

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::Begin
          (TestResponseProxy *this,string *use_symbolName,string *use_moduleName)

{
  ILogger *pIVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->symbolName,use_symbolName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->moduleName,use_moduleName);
  this->assertCount = 0;
  this->errorCount = 0;
  this->testResult = kTestResult_Pass;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"TestResponseProxy",&local_31);
  pIVar1 = gnilk::Logger::GetLogger(&local_30);
  this->pLogger = pIVar1;
  std::__cxx11::string::~string((string *)&local_30);
  Timer::Reset(&this->timer);
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  clear(&(this->assertError).assertErrors);
  return;
}

Assistant:

void TestResponseProxy::Begin(const std::string &use_symbolName, const std::string &use_moduleName) {
    symbolName = use_symbolName;
    moduleName = use_moduleName;
    errorCount = 0;
    assertCount = 0;
    testResult = kTestResult_Pass;
    pLogger = gnilk::Logger::GetLogger("TestResponseProxy");

    // Reset the timer
    timer.Reset();
    assertError.Reset();
}